

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuda_finder.cpp
# Opt level: O1

path * __thiscall
CudaFinder::get_install_dir(path *__return_storage_ptr__,CudaFinder *this,path *path_)

{
  _List *p_Var1;
  byte bVar2;
  pointer pcVar3;
  int iVar4;
  path *ppVar5;
  path *ppVar6;
  path *__range1;
  path *ppVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  std::filesystem::__cxx11::path::path(__return_storage_ptr__);
  p_Var1 = &path_->_M_cmpts;
  if ((*(byte *)&(path_->_M_cmpts)._M_impl._M_t.
                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                 _M_head_impl & 3) == 0) {
    ppVar5 = (path *)std::filesystem::__cxx11::path::_List::begin();
    bVar8 = false;
  }
  else {
    bVar8 = (path_->_M_pathname)._M_string_length == 0;
    ppVar5 = (path *)0x0;
  }
  bVar9 = (*(byte *)&(p_Var1->_M_impl)._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl & 3) == 0;
  if (bVar9) {
    ppVar6 = (path *)std::filesystem::__cxx11::path::_List::end();
  }
  else {
    ppVar6 = (path *)0x0;
  }
  bVar9 = !bVar9;
  bVar10 = bVar8 != bVar9;
  if ((*(byte *)&(p_Var1->_M_impl)._M_t.
                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                 _M_head_impl & 3) == 0) {
    bVar10 = ppVar5 != ppVar6;
  }
  if (bVar10) {
    do {
      ppVar7 = path_;
      if ((*(byte *)&(path_->_M_cmpts)._M_impl._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl & 3) == 0) {
        ppVar7 = ppVar5;
      }
      pcVar3 = (ppVar7->_M_pathname)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar3,pcVar3 + (ppVar7->_M_pathname)._M_string_length);
      if (local_48 == (this->m_target_version)._M_string_length) {
        if (local_48 == 0) {
          bVar10 = true;
        }
        else {
          iVar4 = bcmp(local_50,(this->m_target_version)._M_dataplus._M_p,local_48);
          bVar10 = iVar4 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar10) {
        return __return_storage_ptr__;
      }
      std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,ppVar7);
      bVar2 = *(byte *)&(p_Var1->_M_impl)._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl;
      ppVar7 = (path *)&ppVar5[1]._M_pathname._M_string_length;
      if ((bVar2 & 3) != 0) {
        bVar8 = true;
        ppVar7 = ppVar5;
      }
      ppVar5 = ppVar7;
      bVar10 = bVar8 != bVar9;
      if ((bVar2 & 3) == 0) {
        bVar10 = ppVar5 != ppVar6;
      }
    } while (bVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path CudaFinder::get_install_dir(const fs::path &path_)
{
  fs::path o_path;
  for (auto &p : path_)
    if (p.string() == m_target_version)
      break;
    else
      o_path /= p;
  return o_path;
}